

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

void N_VDestroy_Serial(N_Vector v)

{
  void *pvVar1;
  
  if (v != (N_Vector)0x0) {
    pvVar1 = v->content;
    if (pvVar1 != (void *)0x0) {
      if ((*(int *)((long)pvVar1 + 8) != 0) && (*(void **)((long)pvVar1 + 0x10) != (void *)0x0)) {
        free(*(void **)((long)pvVar1 + 0x10));
        *(undefined8 *)((long)v->content + 0x10) = 0;
      }
      free(v->content);
      v->content = (void *)0x0;
    }
    if (v->ops != (N_Vector_Ops)0x0) {
      free(v->ops);
      v->ops = (N_Vector_Ops)0x0;
    }
    free(v);
    return;
  }
  return;
}

Assistant:

void N_VDestroy_Serial(N_Vector v)
{
  if (v == NULL) { return; }

  /* free content */
  if (v->content != NULL)
  {
    /* free data array if it's owned by the vector */
    if (NV_OWN_DATA_S(v) && NV_DATA_S(v) != NULL)
    {
      free(NV_DATA_S(v));
      NV_DATA_S(v) = NULL;
    }
    free(v->content);
    v->content = NULL;
  }

  /* free ops and vector */
  if (v->ops != NULL)
  {
    free(v->ops);
    v->ops = NULL;
  }
  free(v);
  v = NULL;

  return;
}